

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_generic_tests.h
# Opt level: O1

void density_tests::detail::
     PutTestObject<density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)1>,_2048UL,_2048UL>
     ::consume(consume_operation *i_consume)

{
  runtime_type<> *prVar1;
  TestObject<2048UL,_2048UL> *pTVar2;
  uchar *storage;
  size_t i;
  long lVar3;
  
  prVar1 = density::
           lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
           ::consume_operation::complete_type((consume_operation *)i_consume);
  if (prVar1->m_feature_table !=
      (tuple_type *)
      density::detail::
      FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,density_tests::TestObject<2048ul,2048ul>>
      ::s_table) {
    assert_failed<>("i_consume.complete_type().template is<ElementType>()",
                    "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/generic_tests/queue_generic_tests.h"
                    ,0x14f);
  }
  pTVar2 = density::
           lf_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,(density::consistency_model)1>
           ::consume_operation::element<density_tests::TestObject<2048ul,2048ul>>
                     ((consume_operation *)i_consume);
  lVar3 = 0;
  do {
    if ((pTVar2->m_storage).__data[lVar3] != '\0') {
      assert_failed<>("storage[i] == s_fill_byte",
                      "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/generic_tests/../../test_framework/test_objects.h"
                      ,0x89);
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x800);
  return;
}

Assistant:

static void consume(const typename QUEUE::consume_operation & i_consume)
            {
                DENSITY_TEST_ASSERT(i_consume.complete_type().template is<ElementType>());
                i_consume.template element<ElementType>().check();
            }